

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.hpp
# Opt level: O2

void tf::detail::
     parallel_pdqsort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::less<std::__cxx11::string>,false>
               (Runtime *rt,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *begin
               ,long end,int param_4,byte param_5)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  pair<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_bool>
  pVar7;
  int local_b4;
  anon_class_64_6_4db4d30f local_78;
  
  local_b4 = param_4;
  while( true ) {
    uVar6 = end - (long)begin >> 5;
    if (uVar6 < 0x18) {
      if ((param_5 & 1) == 0) {
        unguarded_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::less<std::__cxx11::string>>
                  (begin,end);
      }
      else {
        insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::less<std::__cxx11::string>>
                  (begin,end);
      }
      return;
    }
    if (uVar6 < 0x801) break;
    uVar4 = uVar6 & 0xffffffffffffffe;
    sort3<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::less<std::__cxx11::string>>
              (begin,&begin->_M_dataplus + uVar4 * 2,(string *)(end + -0x20));
    sort3<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::less<std::__cxx11::string>>
              (begin + 1,&begin[-1]._M_dataplus + uVar4 * 2,(string *)(end + -0x40));
    sort3<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::less<std::__cxx11::string>>
              (begin + 2,&begin[1]._M_dataplus + uVar4 * 2,(string *)(end + -0x60));
    sort3<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::less<std::__cxx11::string>>
              (&begin[-1]._M_dataplus + uVar4 * 2,&begin->_M_dataplus + uVar4 * 2,
               &begin[1]._M_dataplus + uVar4 * 2);
    std::__cxx11::string::swap((string *)begin);
    if (((param_5 & 1) != 0) || (bVar2 = std::operator<(begin + -1,begin), bVar2)) {
      pVar7 = partition_right<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::less<std::__cxx11::string>>
                        (begin,end);
      _Var3 = pVar7.first._M_current;
      uVar5 = (long)_Var3._M_current - (long)begin >> 5;
      pbVar1 = _Var3._M_current + 1;
      uVar4 = end - (long)pbVar1 >> 5;
      if ((uVar5 < uVar6 >> 3) || (uVar4 < uVar6 >> 3)) {
        local_b4 = local_b4 + -1;
        if (local_b4 == 0) {
          std::
          make_heap<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::less<std::__cxx11::string>>
                    (begin,end);
          std::
          sort_heap<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::less<std::__cxx11::string>>
                    (begin,end);
          return;
        }
        if (0x17 < uVar5) {
          std::__cxx11::string::swap((string *)begin);
          std::__cxx11::string::swap((string *)(_Var3._M_current + -1));
          if (0x80 < uVar5) {
            std::__cxx11::string::swap((string *)(begin + 1));
            std::__cxx11::string::swap((string *)(begin + 2));
            std::__cxx11::string::swap((string *)(_Var3._M_current + -2));
            std::__cxx11::string::swap((string *)(_Var3._M_current + -3));
          }
        }
        if (0x17 < uVar4) {
          std::__cxx11::string::swap((string *)pbVar1);
          std::__cxx11::string::swap((string *)(end + -0x20));
          if (0x80 < uVar4) {
            std::__cxx11::string::swap((string *)(_Var3._M_current + 2));
            std::__cxx11::string::swap((string *)(_Var3._M_current + 3));
            std::__cxx11::string::swap((string *)(end + -0x40));
            std::__cxx11::string::swap((string *)(end + -0x60));
          }
        }
      }
      else if (((((undefined1  [16])pVar7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) &&
               (bVar2 = partial_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::less<std::__cxx11::string>>
                                  (begin,_Var3._M_current), bVar2)) &&
              (bVar2 = partial_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::less<std::__cxx11::string>>
                                 (pbVar1,end), bVar2)) {
        return;
      }
      local_78.rt._executor = rt->_executor;
      local_78.rt._17_8_ = *(undefined8 *)((long)&rt->_parent + 1);
      local_78.rt._parent._0_1_ =
           (undefined1)((ulong)*(undefined8 *)((long)&rt->_worker + 1) >> 0x38);
      local_78.rt._worker._0_1_ = SUB81(rt->_worker,0);
      local_78.rt._worker._1_7_ = (undefined7)((ulong)rt->_worker >> 8);
      local_78.bad_allowed = local_b4;
      local_78.begin._M_current = begin;
      local_78.pivot_pos._M_current = _Var3._M_current;
      local_78.leftmost = (bool)param_5;
      Runtime::
      silent_async<tf::detail::parallel_pdqsort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::less<std::__cxx11::string>,false>(tf::Runtime&,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::less<std::__cxx11::string>,int,bool)::_lambda()_1_>
                (rt,&local_78);
      param_5 = 0;
      begin = pbVar1;
    }
    else {
      _Var3 = partition_left<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::less<std::__cxx11::string>>
                        (begin,end);
      begin = _Var3._M_current + 1;
    }
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<std::__cxx11::string>>>
            (begin,end);
  return;
}

Assistant:

void parallel_pdqsort(
  Runtime& rt,
  Iter begin, Iter end, Compare comp,
  int bad_allowed, bool leftmost = true
) {

  // Partitions below this size are sorted sequentially
  constexpr auto cutoff = parallel_sort_cutoff<Iter>();

  // Partitions below this size are sorted using insertion sort
  constexpr auto insertion_sort_threshold = 24;

  // Partitions above this size use Tukey's ninther to select the pivot.
  constexpr auto ninther_threshold = 128;

  //using diff_t = typename std::iterator_traits<Iter>::difference_type;

  // Use a while loop for tail recursion elimination.
  while (true) {

    //diff_t size = end - begin;
    size_t size = end - begin;

    // Insertion sort is faster for small arrays.
    if (size < insertion_sort_threshold) {
      if (leftmost) {
        insertion_sort(begin, end, comp);
      }
      else {
        unguarded_insertion_sort(begin, end, comp);
      }
      return;
    }

    if(size <= cutoff) {
      std::sort(begin, end, comp);
      return;
    }

    // Choose pivot as median of 3 or pseudomedian of 9.
    //diff_t s2 = size / 2;
    size_t s2 = size >> 1;
    if (size > ninther_threshold) {
      sort3(begin, begin + s2, end - 1, comp);
      sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
      sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
      sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
      std::iter_swap(begin, begin + s2);
    }
    else {
      sort3(begin + s2, begin, end - 1, comp);
    }

    // If *(begin - 1) is the end of the right partition
    // of a previous partition operation, there is no element in [begin, end)
    // that is smaller than *(begin - 1).
    // Then if our pivot compares equal to *(begin - 1) we change strategy,
    // putting equal elements in the left partition,
    // greater elements in the right partition.
    // We do not have to recurse on the left partition,
    // since it's sorted (all equal).
    if (!leftmost && !comp(*(begin - 1), *begin)) {
      begin = partition_left(begin, end, comp) + 1;
      continue;
    }

    // Partition and get results.
    const auto pair = Branchless ? partition_right_branchless(begin, end, comp) :
                                   partition_right(begin, end, comp);
       
    const auto pivot_pos = pair.first;
    const auto already_partitioned = pair.second;

    // Check for a highly unbalanced partition.
    //diff_t l_size = pivot_pos - begin;
    //diff_t r_size = end - (pivot_pos + 1);
    const size_t l_size = pivot_pos - begin;
    const size_t r_size = end - (pivot_pos + 1);
    const bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

    // If we got a highly unbalanced partition we shuffle elements
    // to break many patterns.
    if (highly_unbalanced) {
      // If we had too many bad partitions, switch to heapsort
      // to guarantee O(n log n).
      if (--bad_allowed == 0) {
        std::make_heap(begin, end, comp);
        std::sort_heap(begin, end, comp);
        return;
      }

      if (l_size >= insertion_sort_threshold) {
        std::iter_swap(begin, begin + l_size / 4);
        std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);
        if (l_size > ninther_threshold) {
          std::iter_swap(begin + 1, begin + (l_size / 4 + 1));
          std::iter_swap(begin + 2, begin + (l_size / 4 + 2));
          std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
          std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
        }
      }

      if (r_size >= insertion_sort_threshold) {
        std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
        std::iter_swap(end - 1,                   end - r_size / 4);
        if (r_size > ninther_threshold) {
          std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
          std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
          std::iter_swap(end - 2,             end - (1 + r_size / 4));
          std::iter_swap(end - 3,             end - (2 + r_size / 4));
        }
      }
    }
    // decently balanced
    else {
      // sequence try to use insertion sort.
      if (already_partitioned &&
          partial_insertion_sort(begin, pivot_pos, comp) &&
          partial_insertion_sort(pivot_pos + 1, end, comp)
      ) {
        return;
      }
    }

    // Sort the left partition first using recursion and
    // do tail recursion elimination for the right-hand partition.
    // here we need to copy runtime so it stays alive during the sort recursion
    rt.silent_async([=] () mutable {
      parallel_pdqsort<Iter, Compare, Branchless>(
        rt, begin, pivot_pos, comp, bad_allowed, leftmost
      );
    });
    begin = pivot_pos + 1;
    leftmost = false;
  }
}